

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_deferring_queue.h
# Opt level: O3

void __thiscall
wasm::UniqueDeferredQueue<wasm::HeapType>::push
          (UniqueDeferredQueue<wasm::HeapType> *this,HeapType item)

{
  _Elt_pointer pHVar1;
  mapped_type *pmVar2;
  HeapType local_18;
  HeapType item_local;
  
  pHVar1 = (this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
           .super__Deque_impl_data._M_finish._M_cur;
  local_18.id = item.id;
  if (pHVar1 == (this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<wasm::HeapType,std::allocator<wasm::HeapType>>::
    _M_push_back_aux<wasm::HeapType_const&>
              ((deque<wasm::HeapType,std::allocator<wasm::HeapType>> *)this,&local_18);
  }
  else {
    pHVar1->id = item.id;
    (this->data).c.super__Deque_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = pHVar1 + 1;
  }
  pmVar2 = std::__detail::
           _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->count,&local_18);
  *pmVar2 = *pmVar2 + 1;
  return;
}

Assistant:

void push(T item) {
    data.push(item);
    count[item]++;
  }